

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadGlobalSection(BinaryReader *this,Offset section_size)

{
  int iVar1;
  Result RVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  bool mutable_;
  Index num_globals;
  Type global_type;
  bool local_3d;
  uint local_3c;
  Type local_38;
  
  iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x24])();
  if (iVar1 == 0) {
    RVar2 = ReadCount(this,&local_3c,"global count");
    if (RVar2.enum_ != Error) {
      iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x25])(this->delegate_,(ulong)local_3c);
      if (iVar1 == 0) {
        if (local_3c != 0) {
          uVar4 = 0;
          do {
            uVar5 = this->num_global_imports_ + uVar4;
            RVar2 = ReadGlobalHeader(this,&local_38,&local_3d);
            if (RVar2.enum_ == Error) {
              return (Result)Error;
            }
            iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x26])
                              (this->delegate_,(ulong)uVar5,local_38);
            if (iVar1 != 0) {
              pcVar3 = "BeginGlobal callback failed";
              goto LAB_00155a97;
            }
            iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x27])
                              (this->delegate_,(ulong)uVar5);
            if (iVar1 != 0) {
              pcVar3 = "BeginGlobalInitExpr callback failed";
              goto LAB_00155a97;
            }
            RVar2 = ReadInstructions(this,true,this->read_end_,(Opcode *)0x0);
            if (RVar2.enum_ == Error) {
              return (Result)Error;
            }
            iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x28])
                              (this->delegate_,(ulong)uVar5);
            if (iVar1 != 0) {
              pcVar3 = "EndGlobalInitExpr callback failed";
              goto LAB_00155a97;
            }
            iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x29])
                              (this->delegate_,(ulong)uVar5);
            if (iVar1 != 0) {
              pcVar3 = "EndGlobal callback failed";
              goto LAB_00155a97;
            }
            uVar4 = uVar4 + 1;
          } while (local_3c != uVar4);
        }
        iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x2a])();
        if (iVar1 == 0) {
          return (Result)Ok;
        }
        pcVar3 = "EndGlobalSection callback failed";
      }
      else {
        pcVar3 = "OnGlobalCount callback failed";
      }
      PrintError(this,pcVar3);
    }
  }
  else {
    pcVar3 = "BeginGlobalSection callback failed";
LAB_00155a97:
    PrintError(this,pcVar3);
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadGlobalSection(Offset section_size) {
  CALLBACK(BeginGlobalSection, section_size);
  Index num_globals;
  CHECK_RESULT(ReadCount(&num_globals, "global count"));
  CALLBACK(OnGlobalCount, num_globals);
  for (Index i = 0; i < num_globals; ++i) {
    Index global_index = num_global_imports_ + i;
    Type global_type;
    bool mutable_;
    CHECK_RESULT(ReadGlobalHeader(&global_type, &mutable_));
    CALLBACK(BeginGlobal, global_index, global_type, mutable_);
    CALLBACK(BeginGlobalInitExpr, global_index);
    CHECK_RESULT(ReadInitExpr(global_index));
    CALLBACK(EndGlobalInitExpr, global_index);
    CALLBACK(EndGlobal, global_index);
  }
  CALLBACK0(EndGlobalSection);
  return Result::Ok;
}